

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

CURLcode Curl_req_send_more(Curl_easy *data)

{
  _Bool _Var1;
  ssize_t sVar2;
  ssize_t nread;
  Curl_easy *pCStack_18;
  CURLcode result;
  Curl_easy *data_local;
  
  pCStack_18 = data;
  if (((((*(uint *)&(data->req).field_0xd1 >> 9 & 1) != 0) ||
       ((*(uint *)&(data->req).field_0xd1 >> 5 & 1) != 0)) || (((data->req).keepon & 0x20U) != 0))
     || (((_Var1 = Curl_bufq_is_full(&(data->req).sendbuf), _Var1 ||
          (sVar2 = Curl_bufq_sipn(&(pCStack_18->req).sendbuf,0,add_from_client,pCStack_18,
                                  (CURLcode *)((long)&nread + 4)), -1 < sVar2)) ||
         (nread._4_4_ == CURLE_AGAIN)))) {
    nread._4_4_ = req_flush(pCStack_18);
    if (nread._4_4_ == CURLE_AGAIN) {
      nread._4_4_ = CURLE_OK;
    }
    data_local._4_4_ = nread._4_4_;
  }
  else {
    data_local._4_4_ = nread._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_req_send_more(struct Curl_easy *data)
{
  CURLcode result;

  /* Fill our send buffer if more from client can be read. */
  if(!data->req.upload_aborted &&
     !data->req.eos_read &&
     !(data->req.keepon & KEEP_SEND_PAUSE) &&
     !Curl_bufq_is_full(&data->req.sendbuf)) {
    ssize_t nread = Curl_bufq_sipn(&data->req.sendbuf, 0,
                                   add_from_client, data, &result);
    if(nread < 0 && result != CURLE_AGAIN)
      return result;
  }

  result = req_flush(data);
  if(result == CURLE_AGAIN)
    result = CURLE_OK;

  return result;
}